

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KktCheck.cpp
# Opt level: O2

void __thiscall KktCheck::chPrimalBounds(KktCheck *this)

{
  double dVar1;
  int iVar2;
  ostream *poVar3;
  
  for (iVar2 = 0; this->i = iVar2, iVar2 < this->numCol; iVar2 = iVar2 + 1) {
    dVar1 = (this->colValue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[iVar2];
    if ((this->tol <
         (this->colLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_start[iVar2] - dVar1) ||
       (this->tol <
        dVar1 - (this->colUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[iVar2])) {
      if (this->print == 1) {
        poVar3 = std::operator<<((ostream *)&std::cout,"Variable ");
        poVar3 = (ostream *)
                 std::ostream::operator<<
                           (poVar3,(this->cIndexRev).super__Vector_base<int,_std::allocator<int>_>.
                                   _M_impl.super__Vector_impl_data._M_start[this->i]);
        std::operator<<(poVar3," infeasible: lb=");
        poVar3 = std::ostream::_M_insert<double>
                           ((this->colLower).super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_start[this->i]);
        std::operator<<(poVar3,", vaule=");
        poVar3 = std::ostream::_M_insert<double>
                           ((this->colValue).super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_start[this->i]);
        std::operator<<(poVar3,",  ub=");
        poVar3 = std::ostream::_M_insert<double>
                           ((this->colUpper).super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_start[this->i]);
        std::endl<char,std::char_traits<char>>(poVar3);
        iVar2 = this->i;
      }
      this->istrueGlb = true;
    }
  }
  return;
}

Assistant:

void KktCheck::chPrimalBounds() {
	for (i=0; i<numCol;i++) {
		if ((colLower[i] - colValue[i] > tol) ||  (colValue[i]- colUpper[i] > tol) ) {
			if (print == 1) 
				cout<<"Variable "<<cIndexRev[i]<<" infeasible: lb="<<colLower[i]<<", vaule="<<colValue[i]<<",  ub="<<colUpper[i]<<endl;
				//cout<<"Variable "<<i<<" infeasible: lb="<<colLower[i]<<", vaule="<<colValue[i]<<",  ub="<<colUpper[i]<<endl;
			istrueGlb = true;
		}
	}
}